

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt,int level)

{
  xmlRelaxNGValidErrorPtr pxVar1;
  xmlRelaxNGValidErrorPtr err;
  int i;
  int level_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  for (err._0_4_ = level; (int)err < ctxt->errNr; err._0_4_ = (int)err + 1) {
    pxVar1 = ctxt->errTab;
    if ((pxVar1[(int)err].flags & 1U) != 0) {
      if (pxVar1[(int)err].arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1[(int)err].arg1);
      }
      pxVar1[(int)err].arg1 = (xmlChar *)0x0;
      if (pxVar1[(int)err].arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar1[(int)err].arg2);
      }
      pxVar1[(int)err].arg2 = (xmlChar *)0x0;
      pxVar1[(int)err].flags = 0;
    }
  }
  ctxt->errNr = level;
  if (ctxt->errNr < 1) {
    ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  }
  return;
}

Assistant:

static void
xmlRelaxNGPopErrors(xmlRelaxNGValidCtxtPtr ctxt, int level)
{
    int i;
    xmlRelaxNGValidErrorPtr err;

#ifdef DEBUG_ERROR
    xmlGenericError(xmlGenericErrorContext,
                    "Pop errors till level %d\n", level);
#endif
    for (i = level; i < ctxt->errNr; i++) {
        err = &ctxt->errTab[i];
        if (err->flags & ERROR_IS_DUP) {
            if (err->arg1 != NULL)
                xmlFree((xmlChar *) err->arg1);
            err->arg1 = NULL;
            if (err->arg2 != NULL)
                xmlFree((xmlChar *) err->arg2);
            err->arg2 = NULL;
            err->flags = 0;
        }
    }
    ctxt->errNr = level;
    if (ctxt->errNr <= 0)
        ctxt->err = NULL;
}